

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O3

void __thiscall FileTest::Test5(FileTest *this)

{
  uint uVar1;
  char buffer [12];
  File *pipe_files [2];
  Selector s;
  undefined8 local_2a8;
  undefined4 local_2a0;
  File *local_298;
  long *local_290;
  Selector local_280 [632];
  
  Selector::Selector(local_280,(char *)0x0);
  local_2a8 = 0x6f57206f6c6c6548;
  local_2a0 = 0x646c72;
  JetHead::File::pipe(&local_298);
  JetHead::File::setSelector((FileListener *)local_298,(Selector *)&this->super_FileListener);
  uVar1 = (**(code **)(*local_290 + 0x18))(local_290,&local_2a8,0xb);
  if (uVar1 != 0xb) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1fe,"Failed to write pipe %d",(ulong)uVar1);
  }
  Selector::~Selector(local_280);
  return;
}

Assistant:

void FileTest::Test5()
{
	File *pipe_files[ 2 ];
	Selector s;
	const char buffer[] = "Hello World";
	
	File::pipe( pipe_files );
	
	pipe_files[ File::PIPE_READER ]->setSelector( (FileListener*)this, &s );

	int length = strlen( buffer );
	
	int res = pipe_files[ File::PIPE_WRITER ]->write( buffer, length );
	
	if ( res != length )
		TestFailed( "Failed to write pipe %d", res );
	
}